

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_strategy.h
# Opt level: O1

int32_t __thiscall charls::decoder_strategy::read_high_bits(decoder_strategy *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  
  if (this->valid_bits_ < 0x10) {
    fill_read_cache(this);
  }
  uVar1 = this->read_cache_;
  if (uVar1 == 0) {
    uVar4 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = (uint)lVar2 ^ 0x3f;
  }
  uVar4 = -(uint)(uVar1 >> 0x30 == 0) | uVar4;
  if ((int)uVar4 < 0) {
    this->valid_bits_ = this->valid_bits_ + -0xf;
    this->read_cache_ = uVar1 << 0xf;
    uVar4 = 0xe;
    do {
      bVar3 = read_bit(this);
      uVar4 = uVar4 + 1;
    } while (!bVar3);
  }
  else {
    skip(this,uVar4 + 1);
  }
  return uVar4;
}

Assistant:

FORCE_INLINE int32_t read_high_bits()
    {
        const int32_t count{peek_0_bits()};
        if (count >= 0)
        {
            skip(count + 1);
            return count;
        }
        skip(15);

        for (int32_t high_bits_count{15};; ++high_bits_count)
        {
            if (read_bit())
                return high_bits_count;
        }
    }